

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O1

void ApprovalTests::FileUtils::writeToFile(string *filePath,string *content)

{
  runtime_error *this;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [32];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  ::std::ofstream::ofstream(local_220,(filePath->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_200[(long)*(_func_int **)(local_220._0_8_ + -0x18)] & 5) == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_220,(content->_M_dataplus)._M_p,content->_M_string_length);
    local_220._0_8_ = _VTT;
    *(undefined8 *)(local_220 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
    ::std::filebuf::~filebuf((filebuf *)(local_220 + 8));
    ::std::ios_base::~ios_base(local_128);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_240,"Unable to write file: ",filePath);
  ::std::runtime_error::runtime_error(this,(string *)&local_240);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FileUtils::writeToFile(const std::string& filePath, const std::string& content)
    {
        std::ofstream out(filePath.c_str(), std::ios::binary | std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + filePath);
        }
        out << content;
    }